

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestNothing_Test::TestBody
          (PriceFieldTest_TestNothing_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_118;
  Message local_110 [2];
  logic_error *anon_var_0_3;
  byte local_d9;
  char *pcStack_d8;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  Message local_c8 [2];
  logic_error *anon_var_0_2;
  char *pcStack_b0;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_a0 [2];
  logic_error *anon_var_0_1;
  char *pcStack_88;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_78 [2];
  logic_error *anon_var_0;
  char *pcStack_60;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_50 [3];
  Type local_38 [2];
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  PriceField field;
  PriceFieldTest_TestNothing_Test *this_local;
  
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&gtest_ar.message_);
  local_38[1] = 4;
  local_38[0] = bidfx_public_api::price::PriceField::GetType();
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((EqHelper<false> *)local_30,"PriceField::NOTHING","field.GetType()",local_38 + 1,
             local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x3b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffa0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffa0);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bidfx_public_api::price::PriceField::GetInt();
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_60 = 
      "Expected: field.GetInt() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
      ;
      goto LAB_002515c1;
    }
  }
  else {
LAB_002515c1:
    testing::Message::Message(local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x3c,pcStack_60);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(local_78);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff78,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff78);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bidfx_public_api::price::PriceField::GetLong();
    }
    if ((anon_var_0_1._7_1_ & 1) == 0) {
      pcStack_88 = 
      "Expected: field.GetLong() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
      ;
      goto LAB_0025171a;
    }
  }
  else {
LAB_0025171a:
    testing::Message::Message(local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x3d,pcStack_88);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(local_a0);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff50,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff50);
  if (bVar1) {
    anon_var_0_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bidfx_public_api::price::PriceField::GetDouble();
    }
    if ((anon_var_0_2._7_1_ & 1) == 0) {
      pcStack_b0 = 
      "Expected: field.GetDouble() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
      ;
      goto LAB_0025189a;
    }
  }
  else {
LAB_0025189a:
    testing::Message::Message(local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x3e,pcStack_b0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_3,local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_3);
    testing::Message::~Message(local_c8);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff28,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff28);
  if (bVar1) {
    local_d9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
      std::__cxx11::string::~string((string *)&anon_var_0_3);
    }
    if ((local_d9 & 1) != 0) goto LAB_00251ac7;
    pcStack_d8 = 
    "Expected: field.GetString() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_110);
  testing::internal::AssertHelper::AssertHelper
            (&local_118,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
             ,0x3f,pcStack_d8);
  testing::internal::AssertHelper::operator=(&local_118,local_110);
  testing::internal::AssertHelper::~AssertHelper(&local_118);
  testing::Message::~Message(local_110);
LAB_00251ac7:
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(PriceFieldTest, TestNothing)
{
    PriceField field = PriceField();
    EXPECT_EQ(PriceField::NOTHING, field.GetType());
    EXPECT_THROW(field.GetInt(), std::logic_error);
    EXPECT_THROW(field.GetLong(), std::logic_error);
    EXPECT_THROW(field.GetDouble(), std::logic_error);
    EXPECT_THROW(field.GetString(), std::logic_error);
}